

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::protos::gen::SourceLocation::SourceLocation(SourceLocation *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__SourceLocation_003a2490;
  this->iid_ = 0;
  (this->file_name_)._M_dataplus._M_p = (pointer)&(this->file_name_).field_2;
  (this->file_name_)._M_string_length = 0;
  (this->file_name_).field_2._M_local_buf[0] = '\0';
  (this->function_name_)._M_dataplus._M_p = (pointer)&(this->function_name_).field_2;
  (this->function_name_)._M_string_length = 0;
  (this->function_name_).field_2._M_local_buf[0] = '\0';
  this->line_number_ = 0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

SourceLocation::SourceLocation() = default;